

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void out(int type,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list list;
  char msg [1000];
  undefined8 local_4c8;
  void **local_4c0;
  undefined1 *local_4b8;
  undefined1 local_4a8 [16];
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  undefined8 local_408;
  char local_3f8 [1008];
  
  local_4b8 = local_4a8;
  if (in_AL != '\0') {
    local_478 = in_XMM0_Qa;
    local_468 = in_XMM1_Qa;
    local_458 = in_XMM2_Qa;
    local_448 = in_XMM3_Qa;
    local_438 = in_XMM4_Qa;
    local_428 = in_XMM5_Qa;
    local_418 = in_XMM6_Qa;
    local_408 = in_XMM7_Qa;
  }
  local_4c0 = &list[0].overflow_arg_area;
  local_4c8 = 0x3000000010;
  local_498 = in_RDX;
  local_490 = in_RCX;
  local_488 = in_R8;
  local_480 = in_R9;
  vsnprintf(local_3f8,1000,fmt,&local_4c8);
  switch(type) {
  case 0:
    sendf(-1,1,"ris",0x23,local_3f8);
    ircBot::speak(&irc,local_3f8);
    break;
  case 1:
    goto LAB_001347cd;
  case 2:
    break;
  case 3:
    sendf(-1,1,"ris",0x23,local_3f8);
    return;
  case 4:
    puts(local_3f8);
LAB_001347cd:
    ircBot::speak(&irc,local_3f8);
  default:
    goto switchD_0013472c_default;
  }
  puts(local_3f8);
switchD_0013472c_default:
  return;
}

Assistant:

void out(int type, const char *fmt, ...)
{
    char msg[1000];
    va_list list;
    va_start(list,fmt);
    vsnprintf(msg,1000,fmt,list);
    va_end(list);
    
    switch(type)
    {
        case ECHO_ALL:
        {
            server::sendservmsg(msg);
            irc.speak(msg);
            puts(msg);
            break;
        }
        case ECHO_IRC:
        {
            irc.speak(msg);
            break;
        }
        case ECHO_CONSOLE:
        {
            puts(msg);
            break;
        }
        case ECHO_SERV:
        {
            server::sendservmsg(msg);
            break;
        }
        case ECHO_NOCOLOR:
        {
            puts(msg);
            irc.speak(msg);
            break;
        }
        default:
            break;
    }
}